

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O3

void __thiscall
ADE_DEP_DPFSP::subCrossover(ADE_DEP_DPFSP *this,Permutazione *i1,Permutazione *i2,Permutazione *ris)

{
  ushort uVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  uint uVar4;
  void *__s;
  ulong uVar5;
  ushort *puVar6;
  Permutazione *pPVar7;
  ulong uVar8;
  uint uVar9;
  ushort uVar10;
  ulong uVar11;
  uniform_int_distribution<int> local_60;
  ushort *local_58;
  Permutazione *local_50;
  Permutazione *local_48;
  ADE_DEP_DPFSP *local_40;
  Permutazione *local_38;
  
  uVar5 = (ulong)i1->dimensione;
  local_50 = ris;
  local_48 = i1;
  __s = operator_new__(uVar5);
  local_40 = this;
  local_58 = (ushort *)operator_new__((ulong)(this->istanza).fabbriche << 2);
  if (uVar5 != 0) {
    memset(__s,0,uVar5);
  }
  uVar4 = 0;
  uVar10 = 0;
  uVar3 = 0;
  puVar6 = local_58;
  pPVar7 = local_48;
  local_38 = i2;
  do {
    if ((uVar10 == (ushort)uVar5) || ((local_40->istanza).lavori <= pPVar7->individuo[uVar10])) {
      local_60._M_param._M_b = uVar4;
      if (uVar3 == 0) {
        local_60._M_param._M_a = 0;
        uVar4 = std::uniform_int_distribution<int>::operator()
                          (&local_60,&genRand.gen,&local_60._M_param);
        uVar5 = 0;
        puVar6 = local_58;
      }
      else {
        uVar5 = (ulong)uVar3;
        local_60._M_param._M_a = puVar6[uVar5 - 1] + 1;
        uVar4 = std::uniform_int_distribution<int>::operator()
                          (&local_60,&genRand.gen,&local_60._M_param);
        puVar6 = puVar6 + uVar5;
      }
      *puVar6 = (ushort)uVar4;
      local_58[uVar5 + 1] = uVar10;
      if ((ushort)uVar4 < uVar10) {
        puVar2 = local_48->individuo;
        uVar5 = (ulong)(uVar4 & 0xffff);
        do {
          *(undefined1 *)((long)__s + (ulong)puVar2[uVar5]) = 1;
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar10);
      }
      uVar3 = uVar3 + 2;
      uVar5 = (ulong)local_48->dimensione;
      i2 = local_38;
      puVar6 = local_58;
      pPVar7 = local_48;
    }
    uVar10 = uVar10 + 1;
    uVar4 = (uint)uVar10;
  } while (uVar10 <= (ushort)uVar5);
  uVar3 = i2->dimensione;
  uVar5 = 0;
  uVar8 = 0;
  uVar10 = 0;
  do {
    uVar11 = uVar5 & 0xffff;
    uVar4 = (uint)uVar8;
    if (((ushort)uVar5 == uVar3) ||
       (uVar1 = i2->individuo[uVar11], (local_40->istanza).lavori <= uVar1)) {
      uVar1 = puVar6[uVar10];
      if (puVar6[(ulong)uVar10 + 1] != uVar1) {
        uVar9 = (uint)puVar6[(ulong)uVar10 + 1] - (uint)uVar1;
        memcpy((void *)((ulong)((uVar4 & 0xffff) * 2) + (long)local_50->individuo),
               (void *)((ulong)((uint)uVar1 * 2) + (long)pPVar7->individuo),
               (ulong)((uVar9 & 0xffff) * 2));
        uVar8 = (ulong)(uVar4 + uVar9);
        uVar3 = i2->dimensione;
        puVar6 = local_58;
        pPVar7 = local_48;
      }
      if ((ushort)uVar5 != uVar3) {
        local_50->individuo[uVar8 & 0xffff] = i2->individuo[uVar11];
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      uVar10 = uVar10 + 2;
    }
    else if (*(char *)((long)__s + (ulong)uVar1) == '\0') {
      local_50->individuo[uVar8 & 0xffff] = uVar1;
      uVar8 = (ulong)(uVar4 + 1);
    }
    uVar4 = (int)uVar11 + 1;
    uVar5 = (ulong)uVar4;
    uVar3 = i2->dimensione;
  } while ((ushort)uVar4 <= uVar3);
  operator_delete__(__s);
  operator_delete__(puVar6);
  return;
}

Assistant:

void ADE_DEP_DPFSP::subCrossover(Permutazione* i1, Permutazione* i2, Permutazione* ris) {

	bool* daEliminare = new bool[i1->dimensione];
	unsigned short* indiceTagli = new unsigned short[istanza.fabbriche * 2];

	for (unsigned short i = 0; i < i1->dimensione; i++) {
		daEliminare[i] = false; 
	}

	unsigned short f = 0;

	for (unsigned short i = 0; i <= i1->dimensione; i++) {

		if (i1->individuo[i] >= istanza.lavori || i == i1->dimensione) {

			if (f == 0) indiceTagli[0] = genRand.randIntU(0, i);
			else indiceTagli[f] = genRand.randIntU(indiceTagli[f - 1] + 1, i);

			indiceTagli[f + 1] = i;

			for (unsigned short k = indiceTagli[f]; k < indiceTagli[f + 1]; k++) {
				daEliminare[i1->individuo[k]] = true;
			}

			f += 2;
		}
	}

	unsigned short scostamento = 0;

	f = 0;

	for (unsigned short i = 0; i <= i2->dimensione; i++) {

		if (i2->individuo[i] >= istanza.lavori || i == i2->dimensione) {
			unsigned short lunghezzaSegmento = indiceTagli[f + 1] - indiceTagli[f];
			if (lunghezzaSegmento > 0) {
				memcpy(&(ris->individuo[scostamento]), &(i1->individuo[indiceTagli[f]]),
					lunghezzaSegmento*sizeof(unsigned short));
				scostamento += lunghezzaSegmento;
			}

			if(i != i2->dimensione) ris->individuo[scostamento++] = i2->individuo[i];

			f += 2;
		}
		else if (!daEliminare[i2->individuo[i]]) {
			ris->individuo[scostamento++] = i2->individuo[i];
		}
	}

	delete[] daEliminare;
	delete[] indiceTagli;
}